

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O1

char * ngx_http_set_charset_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_uint_t nVar1;
  void *pvVar2;
  int iVar3;
  ngx_int_t nVar4;
  undefined1 local_38 [8];
  ngx_str_t var;
  
  nVar1 = cmd->offset;
  if (*(long *)((long)conf + nVar1) != -1) {
    return "is duplicate";
  }
  pvVar2 = cf->args->elts;
  if ((nVar1 == 0) && (iVar3 = strcmp(*(char **)((long)pvVar2 + 0x18),"off"), iVar3 == 0)) {
    *(undefined8 *)conf = 0xfffffffffffffffe;
  }
  else {
    if (**(char **)((long)pvVar2 + 0x18) != '$') {
      nVar4 = ngx_http_add_charset
                        (*(ngx_array_t **)(*cf->ctx + ngx_http_charset_filter_module.ctx_index * 8),
                         (ngx_str_t *)((long)pvVar2 + 0x10));
      *(ngx_int_t *)((long)conf + nVar1) = nVar4;
      return (char *)-(ulong)(nVar4 == -1);
    }
    local_38 = (undefined1  [8])(((ngx_str_t *)((long)pvVar2 + 0x10))->len - 1);
    var.len = (size_t)(*(char **)((long)pvVar2 + 0x18) + 1);
    nVar4 = ngx_http_get_variable_index(cf,(ngx_str_t *)local_38);
    *(ngx_int_t *)((long)conf + nVar1) = nVar4;
    if (nVar4 == -1) {
      return (char *)0xffffffffffffffff;
    }
    *(ngx_int_t *)((long)conf + nVar1) = nVar4 + 0x10000;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_set_charset_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ngx_int_t                     *cp;
    ngx_str_t                     *value, var;
    ngx_http_charset_main_conf_t  *mcf;

    cp = (ngx_int_t *) (p + cmd->offset);

    if (*cp != NGX_CONF_UNSET) {
        return "is duplicate";
    }

    value = cf->args->elts;

    if (cmd->offset == offsetof(ngx_http_charset_loc_conf_t, charset)
        && ngx_strcmp(value[1].data, "off") == 0)
    {
        *cp = NGX_HTTP_CHARSET_OFF;
        return NGX_CONF_OK;
    }


    if (value[1].data[0] == '$') {
        var.len = value[1].len - 1;
        var.data = value[1].data + 1;

        *cp = ngx_http_get_variable_index(cf, &var);

        if (*cp == NGX_ERROR) {
            return NGX_CONF_ERROR;
        }

        *cp += NGX_HTTP_CHARSET_VAR;

        return NGX_CONF_OK;
    }

    mcf = ngx_http_conf_get_module_main_conf(cf,
                                             ngx_http_charset_filter_module);

    *cp = ngx_http_add_charset(&mcf->charsets, &value[1]);
    if (*cp == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}